

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable_locks.c
# Opt level: O0

spki_record * create_record(int ASN,int ski_offset,int spki_offset,rtr_socket *socket)

{
  long lVar1;
  spki_record *psVar2;
  long in_FS_OFFSET;
  uint local_34;
  uint32_t i;
  spki_record *record;
  rtr_socket *socket_local;
  int spki_offset_local;
  int ski_offset_local;
  int ASN_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (spki_record *)malloc(0x80);
  psVar2->asn = ASN;
  for (local_34 = 0; local_34 < 0x14; local_34 = local_34 + 1) {
    psVar2->ski[local_34] = (char)local_34 + (char)ski_offset;
  }
  for (local_34 = 0; local_34 < 0x5b; local_34 = local_34 + 1) {
    psVar2->spki[local_34] = (char)local_34 + (char)spki_offset;
  }
  psVar2->socket = socket;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

static struct spki_record *create_record(int ASN, int ski_offset, int spki_offset, struct rtr_socket *socket)
{
	struct spki_record *record = malloc(sizeof(struct spki_record));
	uint32_t i;

	record->asn = ASN;

	for (i = 0; i < sizeof(record->ski); i++)
		record->ski[i] = i + ski_offset;

	for (i = 0; i < sizeof(record->spki); i++)
		record->spki[i] = i + spki_offset;

	record->socket = socket;
	return record;
}